

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O3

string_view __thiscall
absl::anon_unknown_5::GenericFind<absl::(anonymous_namespace)::AnyOfPolicy>
          (anon_unknown_5 *this,char *param_2,size_t param_3,void *param_4,anon_unknown_5 *param_5)

{
  char *pcVar1;
  void *pvVar2;
  char *pcVar3;
  ulong uVar4;
  string_view sVar5;
  
  if (param_3 == 0) {
    if (this != (anon_unknown_5 *)0x0) {
      param_2 = param_2 + (long)param_5 + 1;
    }
    uVar4 = 0;
    pcVar3 = param_2;
  }
  else {
    pcVar1 = param_2 + (long)this;
    pcVar3 = pcVar1;
    if (param_5 < this) {
      uVar4 = 0;
      do {
        pvVar2 = memchr(param_4,(int)param_2[(long)param_5],param_3);
        if (pvVar2 != (void *)0x0) {
          uVar4 = (ulong)(param_5 != (anon_unknown_5 *)0xffffffffffffffff);
          pcVar3 = param_2 + (long)param_5;
          if (param_5 == (anon_unknown_5 *)0xffffffffffffffff) {
            pcVar3 = pcVar1;
          }
          break;
        }
        param_5 = param_5 + 1;
      } while (this != param_5);
    }
    else {
      uVar4 = 0;
    }
  }
  sVar5._M_str = pcVar3;
  sVar5._M_len = uVar4;
  return sVar5;
}

Assistant:

absl::string_view GenericFind(absl::string_view text,
                              absl::string_view delimiter, size_t pos,
                              FindPolicy find_policy) {
  if (delimiter.empty() && text.length() > 0) {
    // Special case for empty string delimiters: always return a zero-length
    // absl::string_view referring to the item at position 1 past pos.
    return absl::string_view(text.data() + pos + 1, 0);
  }
  size_t found_pos = absl::string_view::npos;
  absl::string_view found(text.data() + text.size(),
                          0);  // By default, not found
  found_pos = find_policy.Find(text, delimiter, pos);
  if (found_pos != absl::string_view::npos) {
    found = absl::string_view(text.data() + found_pos,
                              find_policy.Length(delimiter));
  }
  return found;
}